

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

int __thiscall
cxxopts::values::standard_value<unsigned_short>::clone
          (standard_value<unsigned_short> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  undefined1 local_29;
  _func_int **local_28;
  element_type *peStack_20;
  
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_short>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_short>>,cxxopts::values::standard_value<unsigned_short>const&>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_short>,(__gnu_cxx::_Lock_policy)2>
              *)&local_28,(allocator<cxxopts::values::standard_value<unsigned_short>_> *)&local_29,
             (standard_value<unsigned_short> *)__fn);
  (this->super_abstract_value<unsigned_short>).super_Value._vptr_Value = local_28;
  (this->super_abstract_value<unsigned_short>).super_Value.
  super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_20;
  return (int)this;
}

Assistant:

const override
      {
        return std::make_shared<standard_value<T>>(*this);
      }